

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QPoint QMdi::MinOverlapPlacer::findBestPlacement
                 (QRect *domain,QList<QRect> *rects,QList<QRect> *source)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QList<QRect> maxOverlappers;
  QList<QRect> nonInsiders;
  QRect *in_stack_ffffffffffffff78;
  QPoint local_60;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined1 in_stack_ffffffffffffffd0 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findNonInsiders(in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
  bVar2 = QList<QRect>::empty((QList<QRect> *)0x60d7ad);
  if (bVar2) {
    findMaxOverlappers((QRect *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffa8._8_8_);
    findMinOverlapRect(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
    local_60 = QRect::topLeft(in_stack_ffffffffffffff78);
    QList<QRect>::~QList((QList<QRect> *)0x60d855);
  }
  else {
    findMinOverlapRect(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
    local_60 = QRect::topLeft(in_stack_ffffffffffffff78);
  }
  QList<QRect>::~QList((QList<QRect> *)0x60d85f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_60;
  }
  __stack_chk_fail();
}

Assistant:

QPoint MinOverlapPlacer::findBestPlacement(const QRect &domain, const QList<QRect> &rects,
                                           QList<QRect> &source)
{
    const QList<QRect> nonInsiders = findNonInsiders(domain, source);

    if (!source.empty())
        return findMinOverlapRect(source, rects).topLeft();

    QList<QRect> maxOverlappers = findMaxOverlappers(domain, nonInsiders);
    return findMinOverlapRect(maxOverlappers, rects).topLeft();
}